

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O1

int __thiscall Js::TypePath::Data::Add<true>(Data *this,PropertyRecord *propId,Type *assignments)

{
  Type *addr;
  byte value;
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  byte bVar6;
  uint uVar7;
  
  value = this->pathLength;
  if (this->pathSize <= value) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x9b,"(currentPathLength < this->pathSize)",
                                "currentPathLength < this->pathSize");
    if (!bVar3) goto LAB_00c44811;
    *puVar5 = 0;
  }
  if (this->pathSize <= value) {
    Throw::InternalError();
  }
  iVar1 = propId->pid;
  bVar6 = *(byte *)((long)(this->map).bucketsData +
                   ((ulong)((long)iVar1 * -0x61c8864680b583eb) >> 0x3c));
  if (bVar6 != 0xff) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      uVar7 = bVar6 & 0x7f;
      iVar4 = 1;
      if ((assignments[uVar7].ptr)->pid != iVar1) {
        if ((char)bVar6 < '\0') {
          iVar4 = 2;
        }
        else {
          if ((*(byte *)((long)(&this->map + 1) + (ulong)uVar7) & 0x7f) == (byte)uVar7 &&
              *(byte *)((long)(&this->map + 1) + (ulong)uVar7) != 0xff) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                        ,0x59,"(next[idx] == NIL || (next[idx] & 127) != idx)",
                                        "next[idx] == NIL || (next[idx] & 127) != idx");
            if (!bVar3) goto LAB_00c44811;
            *puVar5 = 0;
          }
          bVar6 = *(byte *)((long)(&this->map + 1) + (ulong)uVar7);
          iVar4 = 0;
        }
      }
    } while (iVar4 == 0);
    if (iVar4 != 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                  ,0xa7,"(false)","Adding a duplicate to the type path");
      if (!bVar3) {
LAB_00c44811:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  TinyDictionary::Add(&this->map,propId->pid,value);
  addr = assignments + (uint)value;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = propId;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->pathLength = this->pathLength + '\x01';
  return (uint)value;
}

Assistant:

int Add(const PropertyRecord* propId, Field(const PropertyRecord *)* assignments)
            {
                uint currentPathLength = this->pathLength;
                Assert(currentPathLength < this->pathSize);
                if (currentPathLength >= this->pathSize)
                {
                    Throw::InternalError();
                }

                if (addNewId)
                {
#if DBG
                    PropertyIndex temp;
                    if (this->map.TryGetValue(propId->GetPropertyId(), &temp, assignments))
                    {
                        AssertMsg(false, "Adding a duplicate to the type path");
                    }
#endif
                    this->map.Add((unsigned int)propId->GetPropertyId(), (byte)currentPathLength);
                }
                assignments[currentPathLength] = propId;
                this->pathLength++;
                return currentPathLength;
            }